

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O3

void btSolveL1(btScalar *L,btScalar *B,int n,int lskip1)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  btScalar *pbVar16;
  btScalar *pbVar17;
  btScalar *pbVar18;
  ulong uVar19;
  btScalar *pbVar20;
  float *pfVar21;
  long lVar22;
  btScalar *pbVar23;
  long lVar24;
  float *pfVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  btScalar *pbVar29;
  btScalar *pbVar30;
  ulong uVar31;
  btScalar *pbVar32;
  long lVar33;
  btScalar *pbVar34;
  btScalar *pbVar35;
  btScalar *pbVar36;
  btScalar *pbVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  int local_16c;
  btScalar *local_160;
  btScalar *local_158;
  btScalar *local_150;
  btScalar *local_148;
  btScalar *local_140;
  btScalar *local_138;
  btScalar *local_130;
  btScalar *local_128;
  btScalar *local_120;
  btScalar *local_118;
  btScalar *local_110;
  btScalar *local_108;
  btScalar *local_100;
  btScalar *local_f8;
  btScalar *local_b0;
  btScalar *local_a8;
  btScalar *local_98;
  btScalar *local_90;
  btScalar *local_88;
  
  uVar19 = 0;
  if (3 < n) {
    iVar13 = lskip1 * 3;
    lVar22 = (long)lskip1;
    lVar33 = (long)(lskip1 * 2);
    iVar14 = lskip1 * 3 + 1;
    iVar15 = lskip1 * 3 + 2;
    local_a8 = L + (lskip1 + 1);
    pbVar23 = L + (lskip1 + 2);
    pbVar35 = L + (long)(lskip1 * 2 + 2) + 1;
    local_90 = L + (lskip1 + 3);
    local_88 = L + (lskip1 * 3 + 3);
    local_98 = L + (lskip1 + 4);
    pbVar17 = L + (long)(lskip1 * 2 + 4) + 1;
    pbVar36 = L + (lskip1 * 3 + 4);
    local_f8 = L + (lskip1 + 5);
    pbVar20 = L + (lskip1 * 3 + 5);
    local_100 = L + (lskip1 + 6);
    pbVar16 = L + (long)(lskip1 * 2 + 6) + 1;
    local_108 = L + (lskip1 * 3 + 6);
    local_110 = L + (lskip1 + 7);
    local_118 = L + (lskip1 * 3 + 7);
    local_120 = L + (lskip1 + 8);
    pbVar32 = L + (long)(lskip1 * 2 + 8) + 1;
    local_128 = L + (lskip1 * 3 + 8);
    local_130 = L + (lskip1 + 9);
    local_138 = L + (lskip1 * 3 + 9);
    local_140 = L + (lskip1 + 10);
    pbVar30 = L + (long)(lskip1 * 2 + 10) + 1;
    local_148 = L + (lskip1 * 3 + 10);
    local_150 = L + (lskip1 + 0xb);
    local_158 = L + (lskip1 * 3 + 0xb);
    local_160 = L + lVar22;
    pbVar18 = L + lVar33 + 1;
    pbVar29 = L + iVar13;
    pbVar34 = L + iVar14;
    local_b0 = L + iVar15;
    local_16c = 0xc;
    uVar19 = 0;
    pbVar37 = L;
    do {
      if (uVar19 < 0xc) {
        pfVar21 = L + uVar19 * lVar22;
        fVar38 = 0.0;
        fVar39 = 0.0;
        fVar40 = 0.0;
        fVar41 = 0.0;
        iVar27 = (int)uVar19;
        pfVar25 = B;
      }
      else {
        fVar38 = 0.0;
        fVar39 = 0.0;
        fVar40 = 0.0;
        fVar41 = 0.0;
        lVar24 = 0;
        iVar26 = local_16c;
        do {
          iVar27 = iVar26;
          fVar1 = *(float *)((long)B + lVar24);
          fVar2 = *(float *)((long)B + lVar24 + 4);
          fVar3 = *(float *)((long)B + lVar24 + 8);
          fVar4 = *(float *)((long)B + lVar24 + 0xc);
          fVar5 = *(float *)((long)B + lVar24 + 0x10);
          fVar6 = *(float *)((long)B + lVar24 + 0x14);
          fVar7 = *(float *)((long)B + lVar24 + 0x18);
          fVar8 = *(float *)((long)B + lVar24 + 0x1c);
          fVar9 = *(float *)((long)B + lVar24 + 0x20);
          fVar10 = *(float *)((long)B + lVar24 + 0x24);
          fVar11 = *(float *)((long)B + lVar24 + 0x28);
          fVar12 = *(float *)((long)B + lVar24 + 0x2c);
          fVar38 = fVar12 * *(float *)((long)pbVar30 + lVar24) +
                   fVar11 * *(float *)((long)pbVar30 + lVar24 + -4) +
                   fVar10 * *(float *)((long)pbVar32 + lVar24) +
                   fVar9 * *(float *)((long)pbVar32 + lVar24 + -4) +
                   fVar8 * *(float *)((long)pbVar16 + lVar24) +
                   fVar7 * *(float *)((long)pbVar16 + lVar24 + -4) +
                   fVar6 * *(float *)((long)pbVar17 + lVar24) +
                   fVar5 * *(float *)((long)pbVar17 + lVar24 + -4) +
                   fVar4 * *(float *)((long)pbVar35 + lVar24) +
                   fVar3 * *(float *)((long)pbVar35 + lVar24 + -4) +
                   fVar2 * *(float *)((long)pbVar18 + lVar24) +
                   fVar1 * *(float *)((long)pbVar18 + lVar24 + -4) + fVar38;
          fVar39 = fVar12 * *(float *)((long)local_158 + lVar24) +
                   fVar11 * *(float *)((long)local_148 + lVar24) +
                   fVar10 * *(float *)((long)local_138 + lVar24) +
                   fVar9 * *(float *)((long)local_128 + lVar24) +
                   fVar8 * *(float *)((long)local_118 + lVar24) +
                   fVar7 * *(float *)((long)local_108 + lVar24) +
                   fVar6 * *(float *)((long)pbVar20 + lVar24) +
                   fVar5 * *(float *)((long)pbVar36 + lVar24) +
                   fVar4 * *(float *)((long)local_88 + lVar24) +
                   fVar3 * *(float *)((long)local_b0 + lVar24) +
                   fVar2 * *(float *)((long)pbVar34 + lVar24) +
                   fVar1 * *(float *)((long)pbVar29 + lVar24) + fVar39;
          fVar40 = fVar12 * *(float *)((long)local_150 + lVar24) +
                   fVar11 * *(float *)((long)local_140 + lVar24) +
                   fVar10 * *(float *)((long)local_130 + lVar24) +
                   fVar9 * *(float *)((long)local_120 + lVar24) +
                   fVar8 * *(float *)((long)local_110 + lVar24) +
                   fVar7 * *(float *)((long)local_100 + lVar24) +
                   fVar6 * *(float *)((long)local_f8 + lVar24) +
                   fVar5 * *(float *)((long)local_98 + lVar24) +
                   fVar4 * *(float *)((long)local_90 + lVar24) +
                   fVar3 * *(float *)((long)pbVar23 + lVar24) +
                   fVar2 * *(float *)((long)local_a8 + lVar24) +
                   fVar1 * *(float *)((long)local_160 + lVar24) + fVar40;
          fVar41 = fVar12 * *(float *)((long)pbVar37 + lVar24 + 0x2c) +
                   fVar11 * *(float *)((long)pbVar37 + lVar24 + 0x28) +
                   fVar10 * *(float *)((long)pbVar37 + lVar24 + 0x24) +
                   fVar9 * *(float *)((long)pbVar37 + lVar24 + 0x20) +
                   fVar8 * *(float *)((long)pbVar37 + lVar24 + 0x1c) +
                   fVar7 * *(float *)((long)pbVar37 + lVar24 + 0x18) +
                   fVar6 * *(float *)((long)pbVar37 + lVar24 + 0x14) +
                   fVar5 * *(float *)((long)pbVar37 + lVar24 + 0x10) +
                   fVar4 * *(float *)((long)pbVar37 + lVar24 + 0xc) +
                   fVar3 * *(float *)((long)pbVar37 + lVar24 + 8) +
                   fVar2 * *(float *)((long)pbVar37 + lVar24 + 4) +
                   fVar1 * *(float *)((long)pbVar37 + lVar24) + fVar41;
          iVar26 = iVar27 + -0xc;
          lVar24 = lVar24 + 0x30;
        } while (0x17 < iVar26);
        iVar27 = iVar27 + -0x18;
        pfVar21 = (float *)((long)pbVar37 + lVar24);
        pfVar25 = (float *)(lVar24 + (long)B);
      }
      if (0 < iVar27) {
        uVar28 = iVar27 + 1;
        do {
          fVar1 = *pfVar25;
          fVar38 = fVar38 + fVar1 * pfVar21[lVar33];
          fVar39 = fVar39 + fVar1 * pfVar21[iVar13];
          fVar40 = fVar40 + fVar1 * pfVar21[lVar22];
          fVar41 = fVar41 + fVar1 * *pfVar21;
          pfVar21 = pfVar21 + 1;
          pfVar25 = pfVar25 + 1;
          uVar28 = uVar28 - 1;
        } while (1 < uVar28);
      }
      fVar41 = *pfVar25 - fVar41;
      *pfVar25 = fVar41;
      fVar40 = (pfVar25[1] - fVar40) - pfVar21[lVar22] * fVar41;
      pfVar25[1] = fVar40;
      fVar38 = ((pfVar25[2] - fVar38) - pfVar21[lVar33] * fVar41) - pfVar21[lskip1 * 2 + 1] * fVar40
      ;
      pfVar25[2] = fVar38;
      pfVar25[3] = (((pfVar25[3] - fVar39) - fVar41 * pfVar21[iVar13]) - fVar40 * pfVar21[iVar14]) -
                   fVar38 * pfVar21[iVar15];
      uVar19 = uVar19 + 4;
      local_16c = local_16c + 4;
      local_160 = local_160 + lVar22 * 4;
      pbVar18 = pbVar18 + lVar22 * 4;
      pbVar29 = pbVar29 + lVar22 * 4;
      local_a8 = local_a8 + lVar22 * 4;
      pbVar34 = pbVar34 + lVar22 * 4;
      pbVar23 = pbVar23 + lVar22 * 4;
      pbVar35 = pbVar35 + lVar22 * 4;
      local_b0 = local_b0 + lVar22 * 4;
      local_90 = local_90 + lVar22 * 4;
      local_88 = local_88 + lVar22 * 4;
      local_98 = local_98 + lVar22 * 4;
      pbVar17 = pbVar17 + lVar22 * 4;
      pbVar36 = pbVar36 + lVar22 * 4;
      local_f8 = local_f8 + lVar22 * 4;
      pbVar20 = pbVar20 + lVar22 * 4;
      local_100 = local_100 + lVar22 * 4;
      pbVar16 = pbVar16 + lVar22 * 4;
      local_108 = local_108 + lVar22 * 4;
      local_110 = local_110 + lVar22 * 4;
      local_118 = local_118 + lVar22 * 4;
      local_120 = local_120 + lVar22 * 4;
      pbVar32 = pbVar32 + lVar22 * 4;
      local_128 = local_128 + lVar22 * 4;
      local_130 = local_130 + lVar22 * 4;
      local_138 = local_138 + lVar22 * 4;
      local_140 = local_140 + lVar22 * 4;
      pbVar30 = pbVar30 + lVar22 * 4;
      local_148 = local_148 + lVar22 * 4;
      local_150 = local_150 + lVar22 * 4;
      local_158 = local_158 + lVar22 * 4;
      pbVar37 = pbVar37 + lVar22 * 4;
    } while (uVar19 <= n - 4);
  }
  if ((int)uVar19 < n) {
    uVar19 = uVar19 & 0xffffffff;
    do {
      pfVar21 = L + uVar19 * (long)lskip1;
      fVar38 = 0.0;
      uVar28 = (uint)uVar19;
      pbVar23 = B;
      if (0xb < uVar19) {
        uVar31 = uVar19 & 0xffffffff;
        do {
          iVar13 = (int)uVar31;
          uVar28 = iVar13 - 0xc;
          fVar38 = pfVar21[0xb] * pbVar23[0xb] +
                   pfVar21[10] * pbVar23[10] +
                   pfVar21[9] * pbVar23[9] +
                   pfVar21[8] * pbVar23[8] +
                   pfVar21[7] * pbVar23[7] +
                   pfVar21[6] * pbVar23[6] +
                   pfVar21[5] * pbVar23[5] +
                   pfVar21[4] * pbVar23[4] +
                   pfVar21[3] * pbVar23[3] +
                   pfVar21[2] * pbVar23[2] + pfVar21[1] * pbVar23[1] + *pfVar21 * *pbVar23 + fVar38;
          pfVar21 = pfVar21 + 0xc;
          pbVar23 = pbVar23 + 0xc;
          uVar31 = (ulong)uVar28;
        } while (0x17 < iVar13);
      }
      if (0 < (int)uVar28) {
        uVar28 = uVar28 + 1;
        do {
          fVar38 = fVar38 + *pfVar21 * *pbVar23;
          pfVar21 = pfVar21 + 1;
          pbVar23 = pbVar23 + 1;
          uVar28 = uVar28 - 1;
        } while (1 < uVar28);
      }
      *pbVar23 = *pbVar23 - fVar38;
      uVar19 = uVar19 + 1;
    } while (uVar19 != (uint)n);
  }
  return;
}

Assistant:

void btSolveL1 (const btScalar *L, btScalar *B, int n, int lskip1)
{  
  /* declare variables - Z matrix, p and q vectors, etc */
  btScalar Z11,Z21,Z31,Z41,p1,q1,p2,p3,p4,*ex;
  const btScalar *ell;
  int lskip2,lskip3,i,j;
  /* compute lskip values */
  lskip2 = 2*lskip1;
  lskip3 = 3*lskip1;
  /* compute all 4 x 1 blocks of X */
  for (i=0; i <= n-4; i+=4) {
    /* compute all 4 x 1 block of X, from rows i..i+4-1 */
    /* set the Z matrix to 0 */
    Z11=0;
    Z21=0;
    Z31=0;
    Z41=0;
    ell = L + i*lskip1;
    ex = B;
    /* the inner loop that computes outer products and adds them to Z */
    for (j=i-12; j >= 0; j -= 12) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      p2=ell[lskip1];
      p3=ell[lskip2];
      p4=ell[lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[1];
      q1=ex[1];
      p2=ell[1+lskip1];
      p3=ell[1+lskip2];
      p4=ell[1+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[2];
      q1=ex[2];
      p2=ell[2+lskip1];
      p3=ell[2+lskip2];
      p4=ell[2+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[3];
      q1=ex[3];
      p2=ell[3+lskip1];
      p3=ell[3+lskip2];
      p4=ell[3+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[4];
      q1=ex[4];
      p2=ell[4+lskip1];
      p3=ell[4+lskip2];
      p4=ell[4+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[5];
      q1=ex[5];
      p2=ell[5+lskip1];
      p3=ell[5+lskip2];
      p4=ell[5+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[6];
      q1=ex[6];
      p2=ell[6+lskip1];
      p3=ell[6+lskip2];
      p4=ell[6+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[7];
      q1=ex[7];
      p2=ell[7+lskip1];
      p3=ell[7+lskip2];
      p4=ell[7+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[8];
      q1=ex[8];
      p2=ell[8+lskip1];
      p3=ell[8+lskip2];
      p4=ell[8+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[9];
      q1=ex[9];
      p2=ell[9+lskip1];
      p3=ell[9+lskip2];
      p4=ell[9+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[10];
      q1=ex[10];
      p2=ell[10+lskip1];
      p3=ell[10+lskip2];
      p4=ell[10+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[11];
      q1=ex[11];
      p2=ell[11+lskip1];
      p3=ell[11+lskip2];
      p4=ell[11+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* advance pointers */
      ell += 12;
      ex += 12;
      /* end of inner loop */
    }
    /* compute left-over iterations */
    j += 12;
    for (; j > 0; j--) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      p2=ell[lskip1];
      p3=ell[lskip2];
      p4=ell[lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* advance pointers */
      ell += 1;
      ex += 1;
    }
    /* finish computing the X(i) block */
    Z11 = ex[0] - Z11;
    ex[0] = Z11;
    p1 = ell[lskip1];
    Z21 = ex[1] - Z21 - p1*Z11;
    ex[1] = Z21;
    p1 = ell[lskip2];
    p2 = ell[1+lskip2];
    Z31 = ex[2] - Z31 - p1*Z11 - p2*Z21;
    ex[2] = Z31;
    p1 = ell[lskip3];
    p2 = ell[1+lskip3];
    p3 = ell[2+lskip3];
    Z41 = ex[3] - Z41 - p1*Z11 - p2*Z21 - p3*Z31;
    ex[3] = Z41;
    /* end of outer loop */
  }
  /* compute rows at end that are not a multiple of block size */
  for (; i < n; i++) {
    /* compute all 1 x 1 block of X, from rows i..i+1-1 */
    /* set the Z matrix to 0 */
    Z11=0;
    ell = L + i*lskip1;
    ex = B;
    /* the inner loop that computes outer products and adds them to Z */
    for (j=i-12; j >= 0; j -= 12) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[1];
      q1=ex[1];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[2];
      q1=ex[2];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[3];
      q1=ex[3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[4];
      q1=ex[4];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[5];
      q1=ex[5];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[6];
      q1=ex[6];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[7];
      q1=ex[7];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[8];
      q1=ex[8];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[9];
      q1=ex[9];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[10];
      q1=ex[10];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[11];
      q1=ex[11];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* advance pointers */
      ell += 12;
      ex += 12;
      /* end of inner loop */
    }
    /* compute left-over iterations */
    j += 12;
    for (; j > 0; j--) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* advance pointers */
      ell += 1;
      ex += 1;
    }
    /* finish computing the X(i) block */
    Z11 = ex[0] - Z11;
    ex[0] = Z11;
  }
}